

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeleton.cpp
# Opt level: O2

void __thiscall
CMU462::DynamicScene::Skeleton::draw_pick(Skeleton *this,int *pickID,bool transformed)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  Mesh *pMVar10;
  
  if ((this->super_SceneObject).isGhosted == true) {
    std::
    _Rb_tree<int,_std::pair<const_int,_CMU462::DynamicScene::Joint_*>,_std::_Select1st<std::pair<const_int,_CMU462::DynamicScene::Joint_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_CMU462::DynamicScene::Joint_*>_>_>
    ::clear(&(this->idToJoint)._M_t);
    pMVar10 = this->mesh;
    dVar1 = (pMVar10->super_SceneObject).rotation.x;
    dVar2 = (pMVar10->super_SceneObject).rotation.y;
    dVar3 = (pMVar10->super_SceneObject).rotation.z;
    dVar4 = (pMVar10->super_SceneObject).position.x;
    dVar5 = (pMVar10->super_SceneObject).scale.x;
    dVar6 = (pMVar10->super_SceneObject).position.y;
    dVar7 = (pMVar10->super_SceneObject).scale.y;
    dVar8 = (pMVar10->super_SceneObject).position.z;
    dVar9 = (pMVar10->super_SceneObject).scale.z;
    glPushMatrix();
    glTranslated(dVar4,dVar6,dVar8);
    glRotatef((float)dVar1,0x3f800000,0,0);
    glRotatef((float)dVar2,0,0x3f800000,0);
    glRotatef((float)dVar3,0,0,0x3f800000);
    glScalef((float)dVar5,(float)dVar7,(float)dVar9);
    drawJoint(this,this->root,pickID,true);
    glPopMatrix();
    return;
  }
  return;
}

Assistant:

void Skeleton::draw_pick(int& pickID, bool transformed)
  {
    if (!isGhosted) return;
    idToJoint.clear();
    Vector3D meshPos = mesh->position;
    Vector3D meshRot = mesh->rotation;
    Vector3D meshScale = mesh->scale;

    glPushMatrix();
    glTranslated(meshPos.x, meshPos.y, meshPos.z);
    glRotatef(meshRot.x, 1.0f, 0.0f, 0.0f);
    glRotatef(meshRot.y, 0.0f, 1.0f, 0.0f);
    glRotatef(meshRot.z, 0.0f, 0.0f, 1.0f);
    glScalef(meshScale.x, meshScale.y, meshScale.z);

    drawJoint(root, pickID, true);

    glPopMatrix();
  }